

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IResultCapture * Catch::getResultCapture(void)

{
  int iVar1;
  IContext *pIVar2;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  IResultCapture *capture;
  ReusableStringStream *in_stack_ffffffffffffff58;
  ReusableStringStream *in_stack_ffffffffffffff60;
  string *msg;
  ReusableStringStream *in_stack_ffffffffffffff90;
  string local_58;
  IResultCapture *local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar2 = getCurrentContext();
  iVar1 = (*pIVar2->_vptr_IContext[2])();
  local_30 = (IResultCapture *)CONCAT44(extraout_var,iVar1);
  if (local_30 == (IResultCapture *)0x0) {
    ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff90);
    msg = &local_58;
    SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)msg,
               "/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp"
               ,0x335f);
    ReusableStringStream::operator<<
              (in_stack_ffffffffffffff60,(SourceLineInfo *)in_stack_ffffffffffffff58);
    ReusableStringStream::operator<<
              (in_stack_ffffffffffffff60,(char (*) [26])in_stack_ffffffffffffff58);
    ReusableStringStream::operator<<
              (in_stack_ffffffffffffff60,(char (*) [27])in_stack_ffffffffffffff58);
    ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      throw_logic_error(msg);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

IResultCapture& getResultCapture() {
        if (auto* capture = getCurrentContext().getResultCapture())
            return *capture;
        else
            CATCH_INTERNAL_ERROR("No result capture instance");
    }